

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

RawSchema * __thiscall capnp::SchemaLoader::Impl::loadNative(Impl *this,RawSchema *nativeSchema)

{
  Initializer *pIVar1;
  undefined8 uVar2;
  Initializer *pIVar3;
  uint64_t uVar4;
  word *pwVar5;
  RawSchema **ppRVar6;
  uint16_t *puVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  undefined4 uVar11;
  bool bVar12;
  RequiredSize *sizeReq;
  RawSchema *value;
  RawSchema *pRVar13;
  uint i_1;
  uint i;
  ulong uVar14;
  bool bVar15;
  ArrayPtr<const_capnp::_::RawSchema_*> AVar16;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar17;
  RawSchema *nativeSchema_local;
  Fault f;
  DebugComparison<const_capnp::_::RawSchema_*&,_const_capnp::_::RawSchema_*&> _kjCondition;
  CompatibilityChecker checker;
  Reader existing;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_48;
  
  nativeSchema_local = nativeSchema;
  kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long_const&>
            ((HashMap<unsigned_long,capnp::_::RawSchema*> *)&checker,(unsigned_long *)&this->schemas
            );
  if (checker.loader == (Impl *)0x0) {
    value = kj::Arena::allocate<capnp::_::RawSchema>(&this->arena);
    (value->defaultBrand).scopes = (Scope *)0x0;
    (value->defaultBrand).dependencies = (Dependency *)0x0;
    (value->defaultBrand).scopeCount = 0;
    (value->defaultBrand).dependencyCount = 0;
    (value->defaultBrand).lazyInitializer = (Initializer *)0x0;
    (value->defaultBrand).generic = value;
    value->lazyInitializer = (Initializer *)0x0;
    kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::insert(&this->schemas,nativeSchema->id,value)
    ;
    bVar15 = false;
  }
  else {
    value = (RawSchema *)((checker.loader)->arena).nextChunkSize;
    ppRVar6 = &value->canCastTo;
    if (value->canCastTo != (RawSchema *)0x0) {
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = value->canCastTo == nativeSchema;
      if (_kjCondition.result) {
        return value;
      }
      _kjCondition.left = ppRVar6;
      _kjCondition.right = &nativeSchema_local;
      readMessageUnchecked<capnp::schema::Node>((Reader *)&checker,nativeSchema->encodedNode);
      local_58 = (ArrayPtr<const_char>)
                 capnp::schema::Node::Reader::getDisplayName((Reader *)&checker);
      readMessageUnchecked<capnp::schema::Node>(&existing,(*ppRVar6)->encodedNode);
      local_68 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&existing);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::RawSchema_const*&,capnp::_::RawSchema_const*&>&,char_const(&)[53],unsigned_long_const&,capnp::Text::Reader,capnp::Text::Reader>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x531,FAILED,"schema->canCastTo == nativeSchema",
                 "_kjCondition,\"two different compiled-in type have the same type ID\", nativeSchema->id, readMessageUnchecked<schema::Node>(nativeSchema->encodedNode).getDisplayName(), readMessageUnchecked<schema::Node>(schema->canCastTo->encodedNode).getDisplayName()"
                 ,&_kjCondition,
                 (char (*) [53])"two different compiled-in type have the same type ID",
                 &nativeSchema->id,(Reader *)&local_58,(Reader *)&local_68);
      kj::_::Debug::Fault::fatal(&f);
    }
    readMessageUnchecked<capnp::schema::Node>(&existing,value->encodedNode);
    readMessageUnchecked<capnp::schema::Node>((Reader *)&_kjCondition,nativeSchema->encodedNode);
    checker.nodeName.super_StringPtr.content.ptr = "";
    checker.nodeName.super_StringPtr.content.size_ = 1;
    checker.existingNode._reader.segment._0_1_ = 0;
    checker.existingNode._reader.segment._1_7_ = 0;
    checker.existingNode._reader.capTable._0_1_ = 0;
    checker.existingNode._reader.capTable._1_7_ = 0;
    checker.existingNode._reader.data._0_1_ = 0;
    checker.existingNode._reader.data._1_7_ = 0;
    checker.existingNode._reader.pointers._0_6_ = 0;
    checker.existingNode._reader.pointers._6_2_ = 0;
    checker.existingNode._reader.dataSize = 0;
    checker.existingNode._reader.pointerCount = 0;
    checker.existingNode._reader.nestingLimit = 0x7fffffff;
    checker.replacementNode._reader.segment = (SegmentReader *)0x0;
    checker.replacementNode._reader.capTable = (CapTableReader *)0x0;
    checker.replacementNode._reader.data = (void *)0x0;
    checker.replacementNode._reader.pointers._0_6_ = 0;
    checker.replacementNode._reader.pointers._6_2_ = 0;
    checker.replacementNode._reader.dataSize = 0;
    checker.replacementNode._reader.pointerCount = 0;
    checker.replacementNode._reader.nestingLimit = 0x7fffffff;
    checker.loader = this;
    bVar12 = CompatibilityChecker::shouldReplace(&checker,&existing,(Reader *)&_kjCondition,true);
    pIVar1 = value->lazyInitializer;
    bVar15 = pIVar1 != (Initializer *)0x0;
    if (!bVar12) {
      *ppRVar6 = nativeSchema;
      for (uVar14 = 0; uVar14 < nativeSchema->dependencyCount; uVar14 = uVar14 + 1) {
        loadNative(this,nativeSchema->dependencies[uVar14]);
      }
      if (pIVar1 == (Initializer *)0x0) {
        return value;
      }
      goto LAB_001950d6;
    }
  }
  checker.loader = (Impl *)(nativeSchema->defaultBrand).generic;
  checker.nodeName.super_StringPtr.content.ptr = (char *)(nativeSchema->defaultBrand).scopes;
  checker.nodeName.super_StringPtr.content.size_ = (size_t)(nativeSchema->defaultBrand).dependencies
  ;
  uVar2._0_4_ = (nativeSchema->defaultBrand).scopeCount;
  uVar2._4_4_ = (nativeSchema->defaultBrand).dependencyCount;
  pIVar3 = (nativeSchema->defaultBrand).lazyInitializer;
  checker.existingNode._reader.capTable._0_1_ = SUB81(pIVar3,0);
  checker.existingNode._reader.capTable._1_7_ = (undefined7)((ulong)pIVar3 >> 8);
  checker.existingNode._reader.data._0_1_ =
       (undefined1)*(undefined8 *)&nativeSchema->mayContainCapabilities;
  checker.existingNode._reader.data._1_7_ =
       (undefined7)((ulong)*(undefined8 *)&nativeSchema->mayContainCapabilities >> 8);
  checker.existingNode._reader.segment._0_1_ = (undefined1)(undefined4)uVar2;
  checker.existingNode._reader.segment._1_7_ = (undefined7)((ulong)uVar2 >> 8);
  uVar4 = nativeSchema->id;
  pwVar5 = nativeSchema->encodedNode;
  uVar10 = nativeSchema->encodedSize;
  uVar11 = *(undefined4 *)&nativeSchema->field_0x14;
  ppRVar6 = nativeSchema->dependencies;
  puVar7 = nativeSchema->membersByName;
  uVar8 = nativeSchema->dependencyCount;
  uVar9 = nativeSchema->memberCount;
  pRVar13 = nativeSchema->canCastTo;
  value->membersByDiscriminant = nativeSchema->membersByDiscriminant;
  value->canCastTo = pRVar13;
  value->membersByName = puVar7;
  value->dependencyCount = uVar8;
  value->memberCount = uVar9;
  value->encodedSize = uVar10;
  *(undefined4 *)&value->field_0x14 = uVar11;
  value->dependencies = ppRVar6;
  value->id = uVar4;
  value->encodedNode = pwVar5;
  (value->defaultBrand).generic = (RawSchema *)checker.loader;
  (value->defaultBrand).scopes = (Scope *)checker.nodeName.super_StringPtr.content.ptr;
  (value->defaultBrand).dependencies = (Dependency *)checker.nodeName.super_StringPtr.content.size_;
  (value->defaultBrand).scopeCount = (undefined4)uVar2;
  (value->defaultBrand).dependencyCount = uVar2._4_4_;
  *(ulong *)((long)&(value->defaultBrand).scopeCount + 1) =
       CONCAT17(checker.existingNode._reader.capTable._0_1_,
                checker.existingNode._reader.segment._1_7_);
  *(ulong *)((long)&(value->defaultBrand).lazyInitializer + 1) =
       CONCAT17(checker.existingNode._reader.data._0_1_,checker.existingNode._reader.capTable._1_7_)
  ;
  (value->defaultBrand).generic = value;
  value->canCastTo = nativeSchema;
  AVar16 = kj::Arena::allocateArray<capnp::_::RawSchema_const*>
                     (&this->arena,(ulong)value->dependencyCount);
  for (uVar14 = 0; uVar14 < nativeSchema->dependencyCount; uVar14 = uVar14 + 1) {
    pRVar13 = loadNative(this,nativeSchema->dependencies[uVar14]);
    AVar16.ptr[uVar14] = pRVar13;
    nativeSchema = nativeSchema_local;
  }
  value->dependencies = AVar16.ptr;
  local_48.ptr.field_1.value.ptr = (Scope *)0x0;
  local_48.ptr.field_1.value.size_ = 0;
  local_48.ptr.isSet = true;
  AVar17 = makeBrandedDependencies(this,value,&local_48);
  (value->defaultBrand).dependencies = AVar17.ptr;
  (value->defaultBrand).dependencyCount = (uint32_t)AVar17.size_;
  kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::find<unsigned_long_const&>
            ((HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize> *)&existing,
             (unsigned_long *)&this->structSizeRequirements);
  if (existing._reader.segment != (SegmentReader *)0x0) {
    applyStructSizeRequirement
              (this,value,(uint)*(ushort *)&(existing._reader.segment)->arena,
               (uint)*(ushort *)((long)&(existing._reader.segment)->arena + 2));
  }
  if (!bVar15) {
    return value;
  }
LAB_001950d6:
  value->lazyInitializer = (Initializer *)0x0;
  (value->defaultBrand).lazyInitializer = (Initializer *)0x0;
  return value;
}

Assistant:

_::RawSchema* SchemaLoader::Impl::loadNative(const _::RawSchema* nativeSchema) {
  _::RawSchema* schema;
  bool shouldReplace;
  bool shouldClearInitializer;
  KJ_IF_SOME(match, schemas.find(nativeSchema->id)) {
    schema = match;
    if (schema->canCastTo != nullptr) {
      // Already loaded natively, or we're currently in the process of loading natively and there
      // was a dependency cycle.
      KJ_REQUIRE(schema->canCastTo == nativeSchema,
          "two different compiled-in type have the same type ID",
          nativeSchema->id,
          readMessageUnchecked<schema::Node>(nativeSchema->encodedNode).getDisplayName(),
          readMessageUnchecked<schema::Node>(schema->canCastTo->encodedNode).getDisplayName());
      return schema;
    } else {
      auto existing = readMessageUnchecked<schema::Node>(schema->encodedNode);
      auto native = readMessageUnchecked<schema::Node>(nativeSchema->encodedNode);
      CompatibilityChecker checker(*this);
      shouldReplace = checker.shouldReplace(existing, native, true);
      shouldClearInitializer = schema->lazyInitializer != nullptr;
    }
  } else {
    schema = &arena.allocate<_::RawSchema>();
    memset(&schema->defaultBrand, 0, sizeof(schema->defaultBrand));
    schema->defaultBrand.generic = schema;
    schema->lazyInitializer = nullptr;
    schema->defaultBrand.lazyInitializer = nullptr;
    shouldReplace = true;
    shouldClearInitializer = false;  // already cleared above
    schemas.insert(nativeSchema->id, schema);
  }